

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O2

void __thiscall
HighsSparseMatrix::addVec
          (HighsSparseMatrix *this,HighsInt num_nz,HighsInt *index,double *value,double multiple)

{
  MatrixFormat MVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  double local_40;
  int local_34;
  
  MVar1 = this->format_;
  iVar2 = this->num_col_;
  iVar3 = this->num_row_;
  lVar4 = 0;
  uVar5 = 0;
  if (0 < num_nz) {
    uVar5 = (ulong)(uint)num_nz;
  }
  for (; uVar5 * 4 != lVar4; lVar4 = lVar4 + 4) {
    std::vector<int,_std::allocator<int>_>::push_back
              (&this->index_,(value_type_conflict2 *)((long)index + lVar4));
    local_40 = *(double *)((long)value + lVar4 * 2) * multiple;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(&this->value_,&local_40);
  }
  if (MVar1 == kColwise) {
    iVar3 = iVar2;
  }
  local_34 = num_nz + (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar3];
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&this->start_,&local_34);
  if (this->format_ == kColwise) {
    this->num_col_ = this->num_col_ + 1;
  }
  else {
    this->num_row_ = this->num_row_ + 1;
  }
  return;
}

Assistant:

void HighsSparseMatrix::addVec(const HighsInt num_nz, const HighsInt* index,
                               const double* value, const double multiple) {
  HighsInt num_vec = 0;
  if (this->isColwise()) {
    num_vec = this->num_col_;
  } else {
    num_vec = this->num_row_;
  }
  assert((int)this->start_.size() == num_vec + 1);
  assert((int)this->index_.size() == this->numNz());
  assert((int)this->value_.size() == this->numNz());
  for (HighsInt iEl = 0; iEl < num_nz; iEl++) {
    this->index_.push_back(index[iEl]);
    this->value_.push_back(multiple * value[iEl]);
  }
  this->start_.push_back(this->start_[num_vec] + num_nz);
  if (this->isColwise()) {
    this->num_col_++;
  } else {
    this->num_row_++;
  }
}